

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

Net * __thiscall notch::core::Net::append(Net *this,shared_ptr<notch::core::ALossLayer> *loss)

{
  bool bVar1;
  __shared_ptr_access<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *prevLayer;
  element_type *nextLayer;
  logic_error *plVar2;
  shared_ptr<notch::core::ALossLayer> *loss_local;
  Net *this_local;
  
  bVar1 = std::
          vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
          ::empty(&this->layers);
  if (bVar1) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error(plVar2,"cannot append loss layer to an empty Net");
    __cxa_throw(plVar2,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
  }
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->lossLayer);
  if (!bVar1) {
    std::shared_ptr<notch::core::ALossLayer>::operator=(&this->lossLayer,loss);
    this_00 = (__shared_ptr_access<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                 ::back(&this->layers);
    prevLayer = std::
                __shared_ptr_access<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*(this_00);
    nextLayer = std::
                __shared_ptr_access<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->lossLayer);
    connect<notch::core::ABackpropLayer,notch::core::ALossLayer>(prevLayer,nextLayer);
    return this;
  }
  plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(plVar2,"cannot append another loss layer");
  __cxa_throw(plVar2,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

virtual Net &append(std::shared_ptr<ALossLayer> loss) {
        if (layers.empty()) {
            throw std::logic_error("cannot append loss layer to an empty Net");
        }
        if (!this->lossLayer) {
            // TODO: check loss layer shape and connect the last layer
            // TODO: prevent appending
            this->lossLayer = loss;
            connect(*layers.back(), *lossLayer);
        } else {
            throw std::logic_error("cannot append another loss layer");
        }
        return *this;
    }